

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexArrayObjectTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::VertexAttributeDivisorCase::iterate
          (VertexAttributeDivisorCase *this)

{
  ostringstream *this_00;
  int iVar1;
  GLenum err;
  undefined4 extraout_var;
  CallLogWrapper gl;
  CallLogWrapper CStack_1a8;
  undefined1 local_190 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&CStack_1a8,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_190._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Using VertexAttribDivisor with default VAO.\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expecting no error.",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  CStack_1a8.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&CStack_1a8,0);
  glu::CallLogWrapper::glVertexAttribDivisor(&CStack_1a8,0,3);
  err = glu::CallLogWrapper::glGetError(&CStack_1a8);
  glu::checkError(err,"VertexAttribDivisor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDefaultVertexArrayObjectTests.cpp"
                  ,0x40);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::CallLogWrapper::~CallLogWrapper(&CStack_1a8);
  return STOP;
}

Assistant:

VertexAttributeDivisorCase::IterateResult VertexAttributeDivisorCase::iterate (void)
{
	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Using VertexAttribDivisor with default VAO.\n"
						<< "Expecting no error."
						<< tcu::TestLog::EndMessage;

	gl.enableLogging(true);
	gl.glBindVertexArray(0);

	// Using vertexAttribDivisor with default vao is not an error in ES 3.0.
	gl.glVertexAttribDivisor(0, 3);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "VertexAttribDivisor");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}